

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::Aborted::receive(Aborted *this)

{
  char *pcVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  char (*in_RCX) [41];
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar5;
  String local_198;
  _func_int **local_180;
  _func_int **pp_Stack_178;
  Exception local_170;
  
  _::Debug::makeDescription<char_const(&)[41]>
            (&local_198,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_170,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xbf0,&local_198);
  heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_180,&local_170);
  pp_Var3 = pp_Stack_178;
  pp_Stack_178 = (_func_int **)0x0;
  (this->super_WebSocket)._vptr_WebSocket = local_180;
  this[1].super_WebSocket._vptr_WebSocket = pp_Var3;
  Exception::~Exception(&local_170);
  sVar2 = local_198.content.size_;
  pcVar1 = local_198.content.ptr;
  pPVar4 = extraout_RDX;
  if (local_198.content.ptr != (char *)0x0) {
    local_198.content.ptr = (char *)0x0;
    local_198.content.size_ = 0;
    (**(local_198.content.disposer)->_vptr_ArrayDisposer)
              (local_198.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pPVar4 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }